

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O1

void save_load(gdmf *d,io_buf *model_file,bool read,bool text)

{
  bool bVar1;
  uint32_t uVar2;
  vw *all;
  uint *stride_00;
  ostream *poVar3;
  size_t sVar4;
  weight *data;
  size_t sVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint32_t *puVar6;
  long lVar7;
  uint64_t i;
  uint32_t stride;
  ulong local_1e8;
  uint local_1e0;
  uint local_1dc;
  sparse_parameters *local_1d8;
  ulong local_1d0;
  vw *local_1c8;
  gdmf *local_1c0;
  uint local_1b8 [4];
  undefined1 local_1a8 [376];
  
  local_1e0 = (uint)CONCAT71(in_register_00000009,text);
  all = d->all;
  local_1d0 = (ulong)all->num_bits;
  local_1c0 = d;
  if (((int)CONCAT71(in_register_00000011,read) != 0) &&
     (initialize_regressor(all), all->random_weights == true)) {
    bVar1 = (all->weights).sparse;
    puVar6 = &(all->weights).dense_weights._stride_shift;
    if (bVar1 != false) {
      puVar6 = &(all->weights).sparse_weights._stride_shift;
    }
    local_1b8[0] = 1 << ((byte)*puVar6 & 0x1f);
    if (bVar1 == true) {
      stride_00 = calloc_or_throw<unsigned_int>(1);
      *stride_00 = local_1b8[0];
      (all->weights).sparse_weights.default_data = stride_00;
      (all->weights).sparse_weights.fun = set_rand_wrapper<sparse_parameters>::func;
      set_rand_wrapper<sparse_parameters>::func
                ((all->weights).sparse_weights.default_value,stride_00,0);
    }
    else {
      dense_parameters::set_default<unsigned_int,set_rand_wrapper<dense_parameters>>
                (&(all->weights).dense_weights,local_1b8);
    }
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    local_1e8 = 0;
    local_1d8 = &(all->weights).sparse_weights;
    local_1dc = local_1e0 & 0xff;
    local_1c8 = all;
    do {
      while( true ) {
        uVar2 = local_1c0->rank;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        if (read) {
          sVar4 = io_buf::bin_read_fixed(model_file,(char *)&local_1e8,8,"");
        }
        else {
          sVar4 = bin_text_write_fixed
                            (model_file,(char *)&local_1e8,8,(stringstream *)local_1b8,
                             SUB41(local_1dc,0));
        }
        if (sVar4 == 0) {
          sVar4 = 0;
        }
        else {
          if ((local_1c8->weights).sparse == true) {
            data = sparse_parameters::operator[]
                             (local_1d8,
                              local_1e8 <<
                              ((byte)(local_1c8->weights).sparse_weights._stride_shift & 0x3f));
          }
          else {
            data = (local_1c8->weights).dense_weights._begin +
                   (local_1e8 << ((byte)(local_1c8->weights).dense_weights._stride_shift & 0x3f) &
                   (local_1c8->weights).dense_weights._weight_mask);
          }
          lVar7 = (ulong)(uVar2 * 2) + 1;
          do {
            poVar3 = std::ostream::_M_insert<void_const*>(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            if (read) {
              sVar5 = io_buf::bin_read_fixed(model_file,(char *)data,4,"");
            }
            else {
              sVar5 = bin_text_write_fixed
                                (model_file,(char *)data,4,(stringstream *)local_1b8,
                                 SUB41(local_1dc,0));
            }
            sVar4 = sVar4 + sVar5;
            data = data + 1;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        if ((char)local_1e0 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          if (read) {
            sVar5 = 0;
          }
          else {
            sVar5 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1b8,true);
          }
          sVar4 = sVar4 + sVar5;
        }
        if (!read) break;
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        if (sVar4 == 0) {
          return;
        }
      }
      local_1e8 = local_1e8 + 1;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    } while (local_1e8 >> ((byte)local_1d0 & 0x3f) == 0);
  }
  return;
}

Assistant:

void save_load(gdmf& d, io_buf& model_file, bool read, bool text)
{
  vw& all = *d.all;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
  {
    initialize_regressor(all);
    if (all.random_weights)
    {
      uint32_t stride = all.weights.stride();
      if (all.weights.sparse)
        all.weights.sparse_weights.set_default<uint32_t, set_rand_wrapper<sparse_parameters> >(stride);
      else
        all.weights.dense_weights.set_default<uint32_t, set_rand_wrapper<dense_parameters> >(stride);
    }
  }

  if (model_file.files.size() > 0)
  {
    uint64_t i = 0;
    size_t brw = 1;
    do
    {
      brw = 0;
      size_t K = d.rank * 2 + 1;
      stringstream msg;
      msg << i << " ";
      brw += bin_text_read_write_fixed(model_file, (char*)&i, sizeof(i), "", read, msg, text);
      if (brw != 0)
      {
        weight* w_i = &(all.weights.strided_index(i));
        for (uint64_t k = 0; k < K; k++)
        {
          weight* v = w_i + k;
          msg << v << " ";
          brw += bin_text_read_write_fixed(model_file, (char*)v, sizeof(*v), "", read, msg, text);
        }
      }
      if (text)
      {
        msg << "\n";
        brw += bin_text_read_write_fixed(model_file, nullptr, 0, "", read, msg, text);
      }

      if (!read)
        ++i;
    } while ((!read && i < length) || (read && brw > 0));
  }
}